

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,decimal_fp<double> *fp,
          basic_format_specs<wchar_t> *specs,float_specs fspecs,locale_ref loc)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  type tVar4;
  type tVar5;
  undefined4 extraout_var;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar6;
  uint uVar7;
  wchar_t wVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  sign_t sVar13;
  long lVar14;
  uint uVar15;
  bool bVar16;
  bool pointy;
  undefined3 uStack_11f;
  int significand_size;
  locale_ref local_118;
  wchar_t local_10c;
  sign_t sign;
  wchar_t zero;
  ulong local_100;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_f8;
  wchar_t local_ec;
  basic_format_specs<wchar_t> *local_e8;
  undefined8 local_e0;
  significand_type significand;
  int local_d0;
  int exp;
  significand_type local_c8;
  ulong local_c0;
  float_specs fspecs_local;
  digit_grouping<wchar_t> grouping;
  anon_class_40_8_c3c31ef8 write;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  
  significand = fp->significand;
  local_f8.container = out.container;
  local_e8 = specs;
  local_c8 = significand;
  fspecs_local = fspecs;
  significand_size = get_significand_size<double>(fp);
  local_e0 = CONCAT44(extraout_var,significand_size);
  zero = L'0';
  sVar13 = fspecs._4_4_ >> 8;
  sign = sVar13 & 0xff;
  bVar16 = sign != none;
  tVar4 = to_unsigned<int>(significand_size);
  local_100 = (ulong)(bVar16 + tVar4);
  local_118.locale_ = loc.locale_;
  local_c0 = (ulong)fspecs >> 0x20;
  if ((fspecs._4_4_ >> 0x11 & 1) == 0) {
    local_10c = L'.';
  }
  else {
    local_10c = fmt::v8::detail::decimal_point_impl<wchar_t>(loc);
  }
  iVar12 = fp->exponent;
  iVar9 = (int)local_e0;
  local_d0 = iVar9 + iVar12 + -1;
  local_ec = local_10c;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_d0;
  bVar16 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_fmt::v8::detail::dragonbox::decimal_fp<double>,_wchar_t,_fmt::v8::detail::digit_grouping<wchar_t>_>
           ::anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  uVar3 = local_c0;
  uVar11 = local_100;
  uVar7 = (uint)local_c0;
  uVar15 = fspecs.precision;
  if (bVar16) {
    iVar12 = iVar12 + iVar9;
    if ((uVar7 >> 0x14 & 1) == 0) {
      local_118.locale_ = (void *)((ulong)local_118.locale_._4_4_ << 0x20);
      wVar8 = local_ec;
      if (iVar9 == 1) {
        wVar8 = L'\0';
      }
    }
    else {
      local_118.locale_._0_4_ = 0;
      if (0 < (int)(uVar15 - iVar9)) {
        local_118.locale_._0_4_ = uVar15 - iVar9;
      }
      tVar4 = to_unsigned<int>((int)local_118.locale_);
      uVar11 = local_100 + tVar4;
      wVar8 = local_ec;
    }
    iVar2 = local_d0;
    iVar1 = 1 - iVar12;
    if (0 < iVar12) {
      iVar1 = local_d0;
    }
    iVar12 = 2;
    if (99 < iVar1) {
      iVar12 = (999 < iVar1) + 3;
    }
    tVar4 = to_unsigned<int>((3 - (uint)(wVar8 == L'\0')) + iVar12);
    write._0_8_ = CONCAT44(write._4_4_,sVar13) & 0xffffffff000000ff;
    write.significand = local_c8;
    write.decimal_point = wVar8;
    write.significand_size = iVar9;
    write.zero = L'0';
    write.num_zeros = (int)local_118.locale_;
    write._32_8_ = CONCAT44(iVar2,(int)CONCAT71(write._33_7_,((uVar7 >> 0x10 & 1) == 0) << 5)) |
                   0x45;
    if (0 < local_e8->width) {
      bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_&>
                        (local_f8,local_e8,uVar11 + tVar4,&write);
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar6.container;
    }
    bVar6 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_fmt::v8::detail::dragonbox::decimal_fp<double>,_wchar_t,_fmt::v8::detail::digit_grouping<wchar_t>_>
            ::anon_class_40_8_c3c31ef8::operator()(&write,local_f8.container);
    return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar6.container;
  }
  iVar12 = fp->exponent;
  iVar9 = iVar9 + iVar12;
  exp = iVar9;
  if (iVar12 < 0) {
    if (iVar9 < 1) {
      uVar10 = -iVar9;
      grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar10;
      if (uVar15 < uVar10) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar15;
      }
      if ((int)uVar15 < 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar10;
      }
      if ((int)local_e0 != 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar10;
      }
      if ((int)local_e0 == 0 && (uint)grouping.sep_.grouping._M_dataplus._M_p == 0) {
        _pointy = CONCAT31(uStack_11f,(char)((uVar7 & 0x100000) >> 0x14));
        if ((local_c0 & 0x100000) == 0) {
          iVar12 = 1;
          goto LAB_001a6c1e;
        }
      }
      else {
        _pointy = CONCAT31(uStack_11f,1);
      }
      iVar12 = 2;
LAB_001a6c1e:
      tVar4 = to_unsigned<int>((uint)grouping.sep_.grouping._M_dataplus._M_p);
      write._0_8_ = &sign;
      write.significand = (significand_type)&zero;
      write._16_8_ = &pointy;
      write._24_8_ = &local_10c;
      write._32_8_ = &grouping;
      bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_4_>
                        (local_f8,local_e8,(iVar12 + tVar4) + uVar11,
                         (anon_class_56_7_162c6e41 *)&write);
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar6.container;
    }
    _pointy = uVar15 - (int)local_e0 & (int)(uVar7 << 0xb) >> 0x1f;
    uVar15 = _pointy;
    if ((int)_pointy < 1) {
      uVar15 = 0;
    }
    tVar4 = to_unsigned<int>(uVar15);
    digit_grouping<wchar_t>::digit_grouping(&grouping,local_118,(bool)((byte)(uVar7 >> 0x11) & 1));
    iVar12 = digit_grouping<wchar_t>::count_separators(&grouping,significand_size);
    tVar5 = to_unsigned<int>(iVar12);
    write._0_8_ = &sign;
    write.significand = (significand_type)&significand;
    write._16_8_ = &significand_size;
    write._24_8_ = &exp;
    write._32_8_ = &local_10c;
    bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_3_>
                      (local_f8,local_e8,(ulong)tVar5 + (tVar4 + 1) + local_100,
                       (anon_class_64_8_e6ffa566 *)&write);
    goto LAB_001a6bbb;
  }
  tVar4 = to_unsigned<int>(iVar12);
  lVar14 = tVar4 + local_100;
  _pointy = uVar15 - iVar9;
  if ((uVar7 >> 0x14 & 1) != 0) {
    if ((char)uVar3 == '\x02' || 0 < (int)_pointy) {
      if ((int)_pointy < 1) goto LAB_001a6b29;
    }
    else {
      _pointy = 1;
    }
    tVar4 = to_unsigned<int>(_pointy);
    lVar14 = lVar14 + (ulong)(tVar4 + 1);
  }
LAB_001a6b29:
  digit_grouping<wchar_t>::digit_grouping(&grouping,local_118,(bool)((byte)(uVar7 >> 0x11) & 1));
  iVar12 = digit_grouping<wchar_t>::count_separators(&grouping,significand_size);
  tVar4 = to_unsigned<int>(iVar12);
  write._0_8_ = &sign;
  write.significand = (significand_type)&significand;
  write._16_8_ = &significand_size;
  write._24_8_ = fp;
  write._32_8_ = &grouping;
  bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_2_>
                    (local_f8,local_e8,lVar14 + (ulong)tVar4,(anon_class_72_9_d68ba176 *)&write);
LAB_001a6bbb:
  std::__cxx11::string::~string((string *)&grouping);
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar6.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}